

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O1

ExtKeyType cfd::js::api::HDWalletStructApi::ConvertExtKeyType(string *key_type)

{
  int iVar1;
  ExtKeyType EVar2;
  CfdException *this;
  undefined1 local_40 [32];
  
  iVar1 = std::__cxx11::string::compare((char *)key_type);
  if (iVar1 == 0) {
    EVar2 = kExtPrivkey;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)key_type);
    EVar2 = kExtPubkey;
    if (iVar1 != 0) {
      local_40._0_8_ = "cfdjs_hdwallet.cpp";
      local_40._8_4_ = 0x191;
      local_40._16_8_ = "ConvertExtKeyType";
      core::logger::log<std::__cxx11::string_const&>
                ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                 "Failed to ExtKeyType. Invalid extkeyType passed: extkey_type={}",key_type);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._0_8_ = local_40 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,
                 "Invalid extkeyType passed. extkeyType must be \"extPrivkey\" or \"extPubkey\".",""
                );
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  return EVar2;
}

Assistant:

ExtKeyType HDWalletStructApi::ConvertExtKeyType(const std::string& key_type) {
  ExtKeyType result;
  if (key_type == "extPrivkey") {
    result = ExtKeyType::kExtPrivkey;
  } else if (key_type == "extPubkey") {
    result = ExtKeyType::kExtPubkey;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ExtKeyType. Invalid extkeyType passed: "
        "extkey_type={}",  // NOLINT
        key_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid extkeyType passed. extkeyType must be "
        "\"extPrivkey\" or \"extPubkey\".");
  }
  return result;
}